

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O3

HT_ErrorCode ht_feature_cached_string_enable(HT_Timeline *timeline,HT_Boolean thread_safe)

{
  HT_ErrorCode HVar1;
  HT_Feature *feature;
  HT_FeatureKlass *pHVar2;
  
  feature = (HT_Feature *)ht_alloc(0x10010);
  if (feature == (HT_Feature *)0x0) {
    HVar1 = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    feature->klass = (HT_FeatureKlass *)HT_FeatureCachedString_get_class_feature_klass;
    HVar1 = ht_hash_map_init((HT_HashMap *)(feature + 0x1002));
    if (HVar1 == HT_ERR_OK) {
      HVar1 = ht_hash_map_init((HT_HashMap *)(feature + 2));
      if (HVar1 == HT_ERR_OK) {
        if (thread_safe == 0) {
          feature[1].klass = (HT_FeatureKlass *)0x0;
LAB_00107a31:
          HVar1 = ht_timeline_set_feature(timeline,feature);
          return HVar1;
        }
        pHVar2 = (HT_FeatureKlass *)ht_mutex_create();
        feature[1].klass = pHVar2;
        if (pHVar2 != (HT_FeatureKlass *)0x0) goto LAB_00107a31;
        ht_hash_map_deinit((HT_HashMap *)(feature + 2));
        HVar1 = HT_ERR_UNKNOWN;
      }
      ht_hash_map_deinit((HT_HashMap *)(feature + 0x1002));
    }
    ht_free(feature);
  }
  return HVar1;
}

Assistant:

HT_ErrorCode
ht_feature_cached_string_enable(HT_Timeline* timeline, HT_Boolean thread_safe)
{
    HT_ErrorCode error_code;
    HT_Feature* feature = ht_feature_cached_string_create(thread_safe, &error_code);

    if (!feature)
    {
        return error_code;
    }

    return ht_timeline_set_feature(timeline, feature);
}